

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O0

unique_ptr<pstore::sparse_array<int,_pstore::uint128>,_std::default_delete<pstore::sparse_array<int,_pstore::uint128>_>_>
 pstore::sparse_array<int,pstore::uint128>::
 make_unique<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
           (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            first_index,
           __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
           last_index,initializer_list<int> values)

{
  initializer_list<int> __ils;
  initializer_list<int> __ils_00;
  pointer __p;
  int *first_value;
  int *last_value;
  size_type in_R8;
  initializer_list<int> values_local;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  last_index_local;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  first_index_local;
  
  __p = (pointer)new<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                           (0x20,last_index,
                            (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             )values._M_array);
  __ils_00._M_len = in_R8;
  __ils_00._M_array = (iterator)values._M_len;
  first_value = std::begin<int>(__ils_00);
  __ils._M_len = in_R8;
  __ils._M_array = (iterator)values._M_len;
  last_value = std::end<int>(__ils);
  sparse_array<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,int_const*>
            ((sparse_array<int,pstore::uint128> *)__p,last_index,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )values._M_array,first_value,last_value);
  std::
  unique_ptr<pstore::sparse_array<int,pstore::uint128>,std::default_delete<pstore::sparse_array<int,pstore::uint128>>>
  ::unique_ptr<std::default_delete<pstore::sparse_array<int,pstore::uint128>>,void>
            ((unique_ptr<pstore::sparse_array<int,pstore::uint128>,std::default_delete<pstore::sparse_array<int,pstore::uint128>>>
              *)first_index._M_current,__p);
  return (__uniq_ptr_data<pstore::sparse_array<int,_pstore::uint128>,_std::default_delete<pstore::sparse_array<int,_pstore::uint128>_>,_true,_true>
          )(__uniq_ptr_data<pstore::sparse_array<int,_pstore::uint128>,_std::default_delete<pstore::sparse_array<int,_pstore::uint128>_>,_true,_true>
            )first_index._M_current;
}

Assistant:

auto sparse_array<ValueType, BitmapType>::make_unique (IteratorIdx first_index,
                                                           IteratorIdx last_index,
                                                           std::initializer_list<ValueType> values)
        -> std::unique_ptr<sparse_array> {

        return std::unique_ptr<sparse_array<ValueType, BitmapType>>{
            new (first_index, last_index) sparse_array<ValueType, BitmapType> (
                first_index, last_index, std::begin (values), std::end (values))};
    }